

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O2

err_t cmdRngKbRead(tm_ticks_t *data)

{
  ulong uVar1;
  ulong uVar2;
  bool_t on;
  bool_t bVar3;
  int iVar4;
  tm_ticks_t tVar5;
  tm_ticks_t tVar6;
  tm_ticks_t tVar7;
  int iVar8;
  err_t eVar9;
  long lVar10;
  ulong uVar11;
  
  tVar5 = tmFreq();
  if (tVar5 < 20000000) {
    return 0xca;
  }
  puts("Collecting entropy from keyboard...");
  puts("Please, press different keys avoiding repetitions and long pauses:");
  for (lVar10 = -0x80; lVar10 != 0; lVar10 = lVar10 + 2) {
    putchar(0x2a);
  }
  putchar(0xd);
  on = cmdTermEcho(0);
  tVar6 = tmTicks();
  uVar11 = 0;
  iVar8 = 0;
  do {
    do {
      if (0x7f < uVar11) {
        eVar9 = 0;
LAB_00105b80:
        cmdTermEcho(on);
        putchar(10);
        return eVar9;
      }
      tVar7 = tmTicks();
      if (tVar6 + tVar5 * 5 < tVar7) {
        eVar9 = 0x75;
        goto LAB_00105b80;
      }
      bVar3 = cmdTermKbhit();
    } while ((((bVar3 == 0) || (tVar7 < tVar5 / 0x14 + tVar6)) ||
             (iVar4 = cmdTermGetch(), iVar4 == iVar8)) || ((iVar4 == 0 || (iVar4 == 0xe0))));
    uVar1 = uVar11 + 1;
    data[uVar11] = tVar7 - tVar6;
    uVar2 = uVar11 & 1;
    tVar6 = tVar7;
    uVar11 = uVar1;
    iVar8 = iVar4;
    if (uVar2 == 0) {
      putchar(0x2e);
    }
  } while( true );
}

Assistant:

err_t cmdRngKbRead(tm_ticks_t data[128])
{
	const tm_ticks_t freq = tmFreq(); /* число обновлений таймера в секунду */
	const tm_ticks_t max_delay = freq * 5; /* 5 с */
	const tm_ticks_t min_delay = freq / 20; /* 50 мс */
	register tm_ticks_t ticks;
	register tm_ticks_t t;
	err_t code;
	size_t pos;
	bool_t echo;
	int ch;
	// pre
	ASSERT(memIsValid(data, sizeof(tm_ticks_t) * 128));
	// таймер достаточно точен?
	code = freq >= 20000000u ? ERR_OK : ERR_FILE_NOT_FOUND;
	ERR_CALL_CHECK(code);
	// приглашение к сбору энтропии
	printf("Collecting entropy from keyboard...\n");
	printf("Please, press different keys avoiding repetitions and long pauses:\n");
	for (pos = 128; pos; pos -= 2)
		printf("%c", '*');
	printf("\r");
	// сбор энтропии
	echo = cmdTermEcho(FALSE);
	ASSERT(pos == 0);
	for (ticks = tmTicks(), ch = 0; pos < 128; )
	{
		int c;
		// превышен интервал ожидания?
		t = tmTicks();
		if (t > ticks + max_delay)
		{
			code = ERR_TIMEOUT;
			break;
		}
		// клавиша не нажата? нажата слишком быcтро?
		// нажали ту же клавишу? функциональную клавишу?
		if (!cmdTermKbhit() || t < ticks + min_delay ||
			(c = cmdTermGetch()) == ch || c == 0 || c == 0xE0)
			continue;
		// обрабатать нажатие
		data[pos++] = t - ticks, ticks = t, ch = c;
		if (pos % 2)
			printf(".");
	}
	ticks = t = 0;
	cmdTermEcho(echo);
	printf("\n");
	return code;
}